

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<QSocks5RevivedDatagram*,long_long>
               (QSocks5RevivedDatagram *first,longlong n,QSocks5RevivedDatagram *d_first)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  QHostAddressPrivate *pQVar4;
  QSocks5RevivedDatagram *pQVar5;
  QHostAddress *this;
  QSocks5RevivedDatagram *pQVar6;
  QSocks5RevivedDatagram *pQVar7;
  long in_FS_OFFSET;
  Destructor local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_first + n;
  pQVar7 = first;
  pQVar5 = pQVar6;
  if (first < pQVar6) {
    pQVar7 = pQVar6;
    pQVar5 = first;
  }
  local_30.intermediate = d_first;
  if (pQVar5 != d_first) {
    do {
      pDVar1 = (first->data).d.d;
      (first->data).d.d = (Data *)0x0;
      ((local_30.intermediate)->data).d.d = pDVar1;
      pcVar2 = (first->data).d.ptr;
      (first->data).d.ptr = (char *)0x0;
      ((local_30.intermediate)->data).d.ptr = pcVar2;
      qVar3 = (first->data).d.size;
      (first->data).d.size = 0;
      ((local_30.intermediate)->data).d.size = qVar3;
      pQVar4 = (first->address).d.d.ptr;
      (first->address).d.d.ptr = (QHostAddressPrivate *)0x0;
      ((local_30.intermediate)->address).d.d.ptr = pQVar4;
      (local_30.intermediate)->port = first->port;
      local_30.intermediate = local_30.intermediate + 1;
      first = first + 1;
    } while (local_30.intermediate != pQVar5);
  }
  local_30.iter = &local_30.end;
  for (pQVar5 = local_30.intermediate; pQVar5 != pQVar6; pQVar5 = pQVar5 + 1) {
    pDVar1 = (pQVar5->data).d.d;
    (pQVar5->data).d.d = (first->data).d.d;
    (first->data).d.d = pDVar1;
    pcVar2 = (pQVar5->data).d.ptr;
    (pQVar5->data).d.ptr = (first->data).d.ptr;
    (first->data).d.ptr = pcVar2;
    qVar3 = (pQVar5->data).d.size;
    (pQVar5->data).d.size = (first->data).d.size;
    (first->data).d.size = qVar3;
    pQVar4 = (pQVar5->address).d.d.ptr;
    (pQVar5->address).d.d.ptr = (first->address).d.d.ptr;
    (first->address).d.d.ptr = pQVar4;
    pQVar5->port = first->port;
    first = first + 1;
  }
  local_30.end = d_first;
  if (first != pQVar7) {
    this = &first[-1].address;
    do {
      QHostAddress::~QHostAddress(this);
      pDVar1 = (((QSocks5RevivedDatagram *)(this + -3))->data).d.d;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
          QArrayData::deallocate
                    (&((((QSocks5RevivedDatagram *)(this + -3))->data).d.d)->super_QArrayData,1,0x10
                    );
        }
      }
      pQVar6 = (QSocks5RevivedDatagram *)(this + -3);
      this = this + -5;
    } while (pQVar6 != pQVar7);
  }
  q_relocate_overlap_n_left_move<QSocks5RevivedDatagram_*,_long_long>::Destructor::~Destructor
            (&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}